

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_SetPipeFile(cmsysProcess *cp,int prPipe,char *file)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar2 = 0;
  if (cp != (cmsysProcess *)0x0) {
    uVar3 = prPipe - 1;
    if (uVar3 < 3) {
      uVar4 = (ulong)uVar3;
      if (*(void **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9) != (void *)0x0) {
        free(*(void **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9));
        (cp->PipeNativeSTDIN + uVar4 * 2 + -9)[0] = 0;
        (cp->PipeNativeSTDIN + uVar4 * 2 + -9)[1] = 0;
      }
      if (file == (char *)0x0) {
        iVar2 = 1;
      }
      else {
        sVar1 = strlen(file);
        __dest = (char *)malloc(sVar1 + 1);
        *(char **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9) = __dest;
        iVar2 = 0;
        if (__dest != (char *)0x0) {
          strcpy(__dest,file);
          (cp->PipeNativeSTDIN + (ulong)uVar3 * 2)[0] = -1;
          (cp->PipeNativeSTDIN + (ulong)uVar3 * 2)[1] = -1;
          cmsysProcess_SetPipeShared(cp,prPipe,0);
          iVar2 = 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int kwsysProcess_SetPipeFile(kwsysProcess* cp, int prPipe, const char* file)
{
  char** pfile;
  if (!cp) {
    return 0;
  }
  switch (prPipe) {
    case kwsysProcess_Pipe_STDIN:
      pfile = &cp->PipeFileSTDIN;
      break;
    case kwsysProcess_Pipe_STDOUT:
      pfile = &cp->PipeFileSTDOUT;
      break;
    case kwsysProcess_Pipe_STDERR:
      pfile = &cp->PipeFileSTDERR;
      break;
    default:
      return 0;
  }
  if (*pfile) {
    free(*pfile);
    *pfile = 0;
  }
  if (file) {
    *pfile = (char*)malloc(strlen(file) + 1);
    if (!*pfile) {
      return 0;
    }
    strcpy(*pfile, file);
  }

  /* If we are redirecting the pipe, do not share it or use a native
     pipe.  */
  if (*pfile) {
    kwsysProcess_SetPipeNative(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
  }
  return 1;
}